

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

void __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::add_two_to_empty(basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                   *this,byte key1,node_ptr child1,byte key2,db_leaf_unique_ptr *child2)

{
  basic_leaf<unsigned_long,_unodb::detail::node_header> *pbVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (key1 == key2) {
    __assert_fail("key1 != key2",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x666,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::add_two_to_empty(std::byte, node_ptr, std::byte, db_leaf_unique_ptr) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  if (this->field_0x8 != '\x02') {
    __assert_fail("this->children_count == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x667,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::add_two_to_empty(std::byte, node_ptr, std::byte, db_leaf_unique_ptr) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  uVar3 = (ulong)(key1 < key2);
  uVar5 = (ulong)(key1 >= key2);
  *(byte *)((long)(this->children)._M_elems + (uVar5 - 4)) = key1;
  (this->children)._M_elems[uVar5].value.tagged_ptr = child1.tagged_ptr;
  *(byte *)((long)(this->children)._M_elems + (uVar3 - 4)) = key2;
  pbVar1 = (child2->_M_t).
           super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           .
           super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
           ._M_head_impl;
  (child2->_M_t).
  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
  ._M_head_impl = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)0x0;
  if (((ulong)pbVar1 & 7) != 0) {
    __assert_fail("(result & ptr_bit_mask) == uintptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                  ,0x182,
                  "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::node_header]"
                 );
  }
  (this->children)._M_elems[uVar3].value.tagged_ptr = (uintptr_t)pbVar1;
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if (lVar4 == 1) {
      return;
    }
    lVar2 = lVar4 + 1;
  } while (*(byte *)((long)(this->children)._M_elems + lVar4 + -4) <=
           *(byte *)((long)(this->children)._M_elems + lVar4 + -3));
  if (lVar4 == 1) {
    return;
  }
  __assert_fail("std::is_sorted(keys.byte_array.cbegin(), keys.byte_array.cbegin() + this->children_count)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x676,
                "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::add_two_to_empty(std::byte, node_ptr, std::byte, db_leaf_unique_ptr) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
               );
}

Assistant:

constexpr void add_two_to_empty(std::byte key1, node_ptr child1,
                                  std::byte key2,
                                  db_leaf_unique_ptr child2) noexcept {
    UNODB_DETAIL_ASSERT(key1 != key2);
    UNODB_DETAIL_ASSERT(this->children_count == 2);

    const std::uint8_t key1_i = key1 < key2 ? 0U : 1U;
    const std::uint8_t key2_i = 1U - key1_i;
    keys.byte_array[key1_i] = key1;
    children[key1_i] = child1;
    keys.byte_array[key2_i] = key2;
    children[key2_i] = node_ptr{child2.release(), node_type::LEAF};
#ifndef UNODB_DETAIL_X86_64
    keys.byte_array[2] = unused_key_byte;
    keys.byte_array[3] = unused_key_byte;
#endif

    UNODB_DETAIL_ASSERT(
        std::is_sorted(keys.byte_array.cbegin(),
                       keys.byte_array.cbegin() + this->children_count));
  }